

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonParseReset(JsonParse *pParse)

{
  sqlite3_free(pParse->aNode);
  pParse->nNode = 0;
  pParse->nAlloc = 0;
  pParse->aNode = (JsonNode *)0x0;
  sqlite3_free(pParse->aUp);
  pParse->aUp = (u32 *)0x0;
  return;
}

Assistant:

static void jsonParseReset(JsonParse *pParse){
  sqlite3_free(pParse->aNode);
  pParse->aNode = 0;
  pParse->nNode = 0;
  pParse->nAlloc = 0;
  sqlite3_free(pParse->aUp);
  pParse->aUp = 0;
}